

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O1

void ggml_threadpool_free(ggml_threadpool *threadpool)

{
  ggml_compute_state *pgVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  
  if (threadpool == (ggml_threadpool *)0x0) {
    return;
  }
  lVar4 = (long)threadpool->n_threads_max;
  pgVar1 = threadpool->workers;
  pthread_mutex_lock((pthread_mutex_t *)threadpool);
  LOCK();
  threadpool->stop = true;
  UNLOCK();
  LOCK();
  threadpool->pause = false;
  UNLOCK();
  pthread_cond_broadcast((pthread_cond_t *)&threadpool->cond);
  pthread_mutex_unlock((pthread_mutex_t *)threadpool);
  if (1 < lVar4) {
    lVar3 = 0x220;
    do {
      uVar2 = pthread_join(*(pthread_t *)(pgVar1->cpumask + lVar3 + -8),(void **)0x0);
      if (1 < uVar2) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu.c"
                   ,0xa23,"GGML_ASSERT(%s) failed",
                   "rc == GGML_EXIT_SUCCESS || rc == GGML_EXIT_ABORTED");
      }
      lVar3 = lVar3 + 0x220;
    } while (lVar4 * 0x220 - lVar3 != 0);
  }
  pthread_mutex_destroy((pthread_mutex_t *)threadpool);
  pthread_cond_destroy((pthread_cond_t *)&threadpool->cond);
  ggml_aligned_free(threadpool->workers,lVar4 * 0x220);
  ggml_aligned_free(threadpool,0x140);
  return;
}

Assistant:

void ggml_threadpool_free(struct ggml_threadpool* threadpool) {
    if (!threadpool) return;

    const int n_threads = threadpool->n_threads_max;

#ifndef GGML_USE_OPENMP
    struct ggml_compute_state* workers = threadpool->workers;

    ggml_mutex_lock(&threadpool->mutex);

    threadpool->stop = true;
    threadpool->pause = false;

    ggml_cond_broadcast(&threadpool->cond);
    ggml_mutex_unlock(&threadpool->mutex);

    for (int j = 1; j < n_threads; j++) {
        int32_t rc = ggml_thread_join(workers[j].thrd, NULL);
        GGML_ASSERT(rc == GGML_EXIT_SUCCESS || rc == GGML_EXIT_ABORTED);
        UNUSED(rc);
    }

    ggml_mutex_destroy(&threadpool->mutex);
    ggml_cond_destroy(&threadpool->cond);
#endif // GGML_USE_OPENMP

    const size_t workers_size = sizeof(struct ggml_compute_state) * n_threads;
    ggml_aligned_free(threadpool->workers, workers_size);
    ggml_aligned_free(threadpool, sizeof(struct ggml_threadpool));
}